

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

bool __thiscall
TMapIterator<int,_DLevelScript_*,_TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>_>
::NextPair(TMapIterator<int,_DLevelScript_*,_TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>_>
           *this,Pair **pair)

{
  bool bVar1;
  uint uVar2;
  Pair **pair_local;
  TMapIterator<int,_DLevelScript_*,_TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>_>
  *this_local;
  
  if (this->Position < this->Map->Size) {
    do {
      bVar1 = TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::Node::
              IsNil(this->Map->Nodes + this->Position);
      if (!bVar1) {
        *pair = (Pair *)&this->Map->Nodes[this->Position].Pair;
        this->Position = this->Position + 1;
        return true;
      }
      uVar2 = this->Position + 1;
      this->Position = uVar2;
    } while (uVar2 < this->Map->Size);
  }
  return false;
}

Assistant:

bool NextPair(typename MapType::Pair *&pair)
	{
		if (Position >= Map.Size)
		{
			return false;
		}
		do
		{
			if (!Map.Nodes[Position].IsNil())
			{
				pair = reinterpret_cast<typename MapType::Pair *>(&Map.Nodes[Position].Pair);
				Position += 1;
				return true;
			}
		} while (++Position < Map.Size);
		return false;
	}